

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::_delete_label(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
                *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i,
               bool force_delete)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  long i;
  RealScalar RVar1;
  RealScalar RVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_> local_a0 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false>_> local_68 [56];
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->_idx_to_label).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->_idx_to_label).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,label_i);
  if (__position._M_current ==
      (this->_idx_to_label).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  if (!force_delete) {
    i = (long)__position._M_current -
        (long)(this->_idx_to_label).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)local_68,
               &this->_quadmat,i);
    RVar1 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>_>
            ::squaredNorm(local_68);
    if (2.220446049250313e-16 < RVar1) {
      return;
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_a0,
               &this->_quadmat,i);
    RVar2 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>
            ::squaredNorm(local_a0);
    if (2.220446049250313e-16 < RVar2) {
      return;
    }
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)label_i);
  _delete_label_from_mat<cimod::Dense>(this,&local_c0,(dispatch_t<cimod::Dense,_Dense>)0x0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this->_idx_to_label,(const_iterator)__position._M_current);
  _set_label_to_idx(this);
  return;
}

Assistant:

inline void _delete_label( IndexType label_i, bool force_delete = true ) {
      auto position = std::find( _idx_to_label.begin(), _idx_to_label.end(), label_i );
      if ( position != _idx_to_label.end() ) {
        if ( force_delete == false ) {
          // check if there are corresponding nonzero elements
          size_t i = std::distance( _idx_to_label.begin(), position );
          if ( _quadmat.col( i ).squaredNorm() > std::numeric_limits<FloatType>::epsilon()
               || _quadmat.row( i ).squaredNorm() > std::numeric_limits<FloatType>::epsilon() ) {
            // exists nonzero elements
            return;
          }
        }
        // delete from matrix first
        _delete_label_from_mat( label_i );
        // add label_i
        _idx_to_label.erase( position );
        // already sorted
        // std::sort(_idx_to_label.begin(), _idx_to_label.end());
        _set_label_to_idx();
      }
    }